

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityDamageStatusPdu.cpp
# Opt level: O0

void __thiscall DIS::EntityDamageStatusPdu::EntityDamageStatusPdu(EntityDamageStatusPdu *this)

{
  EntityDamageStatusPdu *this_local;
  
  WarfareFamilyPdu::WarfareFamilyPdu(&this->super_WarfareFamilyPdu);
  (this->super_WarfareFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__EntityDamageStatusPdu_00267560;
  EntityID::EntityID(&this->_damagedEntityID);
  this->_padding1 = 0;
  this->_padding2 = 0;
  this->_numberOfDamageDescription = 0;
  std::vector<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>::vector
            (&this->_damageDescriptionRecords);
  PduSuperclass::setPduType((PduSuperclass *)this,'E');
  return;
}

Assistant:

EntityDamageStatusPdu::EntityDamageStatusPdu() : WarfareFamilyPdu(),
   _damagedEntityID(), 
   _padding1(0), 
   _padding2(0), 
   _numberOfDamageDescription(0)
{
    setPduType( 69 );
}